

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_rectangle<unsigned_char>
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int x1,int y1,int z1,uchar *color,
          float opacity)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 in_EAX;
  undefined4 uVar5;
  CImgArgumentException *this_00;
  char *pcVar6;
  long lVar7;
  undefined1 auVar8 [16];
  
  if (this->_data != (uchar *)0x0) {
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    auVar8._0_4_ = -(uint)(uVar1 == 0);
    auVar8._4_4_ = -(uint)(uVar2 == 0);
    auVar8._8_4_ = -(uint)(uVar3 == 0);
    auVar8._12_4_ = -(uint)(uVar4 == 0);
    uVar5 = movmskps(in_EAX,auVar8);
    if ((char)uVar5 == '\0') {
      if (color == (uchar *)0x0) {
        this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
        pcVar6 = "non-";
        if (this->_is_shared != false) {
          pcVar6 = "";
        }
        CImgArgumentException::CImgArgumentException
                  (this_00,
                   "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::draw_rectangle(): Specified color is (null)."
                   ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                   (ulong)this->_spectrum,this->_data,pcVar6,"unsigned char");
        __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
      }
      if (0 < (int)uVar4) {
        lVar7 = 0;
        do {
          draw_rectangle(this,x0,y0,z0,(int)lVar7,x1,y1,z1,(int)lVar7,color[lVar7],opacity);
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)this->_spectrum);
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_rectangle(const int x0, const int y0, const int z0,
                            const int x1, const int y1, const int z1,
                            const tc *const color, const float opacity=1) {
      if (is_empty()) return *this;
      if (!color)
        throw CImgArgumentException(_cimg_instance
                                    "draw_rectangle(): Specified color is (null).",
                                    cimg_instance);
      cimg_forC(*this,c) draw_rectangle(x0,y0,z0,c,x1,y1,z1,c,(T)color[c],opacity);
      return *this;
    }